

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O1

void __thiscall
DPusher::DPusher(DPusher *this,EPusher type,line_t *l,int magnitude,int angle,AActor *source,
                int affectee)

{
  double dVar1;
  double dVar2;
  
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0084b758;
  (this->m_Source).field_0.p = source;
  this->m_Type = type;
  if (l == (line_t *)0x0) {
    ChangeValues(this,magnitude,angle);
  }
  else {
    dVar2 = (l->delta).X;
    dVar1 = (l->delta).Y;
    (this->m_PushVec).Y = dVar1;
    (this->m_PushVec).X = dVar2;
    dVar2 = c_sqrt(dVar1 * dVar1 + dVar2 * dVar2);
    this->m_Magnitude = dVar2;
  }
  if (source != (AActor *)0x0) {
    this->m_Radius = this->m_Magnitude + this->m_Magnitude;
  }
  this->m_Affectee = affectee;
  return;
}

Assistant:

DPusher::DPusher (DPusher::EPusher type, line_t *l, int magnitude, int angle,
				  AActor *source, int affectee)
{
	m_Source = source;
	m_Type = type;
	if (l)
	{
		m_PushVec = l->Delta();
		m_Magnitude = m_PushVec.Length();
	}
	else
	{ // [RH] Allow setting magnitude and angle with parameters
		ChangeValues (magnitude, angle);
	}
	if (source) // point source exist?
	{
		m_Radius = m_Magnitude * 2; // where force goes to zero
	}
	m_Affectee = affectee;
}